

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<solitaire::geometry::Position_()>::Action
          (Action<solitaire::geometry::Position_()> *this,
          ActionInterface<solitaire::geometry::Position_()> *impl)

{
  ActionAdapter local_28;
  ActionInterface<solitaire::geometry::Position_()> *local_18;
  ActionInterface<solitaire::geometry::Position_()> *impl_local;
  Action<solitaire::geometry::Position_()> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<solitaire::geometry::Position_()> *)this;
  std::shared_ptr<testing::ActionInterface<solitaire::geometry::Position()>>::
  shared_ptr<testing::ActionInterface<solitaire::geometry::Position()>,void>
            ((shared_ptr<testing::ActionInterface<solitaire::geometry::Position()>> *)&local_28,impl
            );
  std::function<solitaire::geometry::Position()>::
  function<testing::Action<solitaire::geometry::Position()>::ActionAdapter,void>
            ((function<solitaire::geometry::Position()> *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}